

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_descriptor.cpp
# Opt level: O0

ssize_t __thiscall
boost::iostreams::detail::file_descriptor_impl::read
          (file_descriptor_impl *this,int __fd,void *__buf,size_t __nbytes)

{
  int *piVar1;
  undefined4 in_register_00000034;
  ssize_t local_38;
  streamsize result;
  streamsize n_local;
  char *s_local;
  file_descriptor_impl *this_local;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  local_38 = ::read(this->handle_,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  piVar1 = __errno_location();
  if (*piVar1 != 0) {
    throw_system_failure("failed reading");
  }
  if (local_38 == 0) {
    local_38 = -1;
  }
  return local_38;
}

Assistant:

std::streamsize file_descriptor_impl::read(char* s, std::streamsize n)
{
#ifdef BOOST_IOSTREAMS_WINDOWS
    DWORD result;
    if (!::ReadFile(handle_, s, n, &result, NULL))
    {
        // report EOF if the write-side of a pipe has been closed
        if (GetLastError() == ERROR_BROKEN_PIPE)
        {
            result = 0;
        }
        else
            throw_system_failure("failed reading");
    }
    return result == 0 ? -1 : static_cast<std::streamsize>(result);
#else // #ifdef BOOST_IOSTREAMS_WINDOWS
    errno = 0;
    std::streamsize result = BOOST_IOSTREAMS_FD_READ(handle_, s, n);
    if (errno != 0)
        throw_system_failure("failed reading");
    return result == 0 ? -1 : result;
#endif // #ifdef BOOST_IOSTREAMS_WINDOWS
}